

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkRestrashWithLatches(Abc_Ntk_t *pNtk,int nLatches)

{
  Abc_Aig_t *pMan;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p1;
  int iVar2;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFromWithLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG,nLatches);
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pObj = Abc_NtkObj(pNtk,iVar2);
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
        pAVar1 = Abc_ObjChild0Copy(pObj);
        p1 = Abc_ObjChild1Copy(pObj);
        pAVar1 = Abc_AigAnd(pMan,pAVar1,p1);
        (pObj->field_6).pCopy = pAVar1;
      }
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    iVar2 = Abc_NtkCheck(pNtkNew);
    if (iVar2 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x248,"Abc_Ntk_t *Abc_NtkRestrashWithLatches(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashWithLatches( Abc_Ntk_t * pNtk, int nLatches )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFromWithLatches( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG, nLatches );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}